

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<double,unsigned_long>
          (Serializer *this,pair<double,_unsigned_long> *pair)

{
  (*this->_vptr_Serializer[6])();
  WriteProperty<double>(this,0,"first",&pair->first);
  WriteProperty<unsigned_long>(this,1,"second",&pair->second);
  (*this->_vptr_Serializer[7])(this);
  return;
}

Assistant:

void WriteValue(const std::pair<K, V> &pair) {
		OnObjectBegin();
		WriteProperty(0, "first", pair.first);
		WriteProperty(1, "second", pair.second);
		OnObjectEnd();
	}